

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsNull(Var instance,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  JavascriptLibrary *pJVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  JavascriptLibrary *library_local;
  Var instance_local;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    this = RecyclableObject::GetScriptContext((RecyclableObject *)instance);
    pJVar3 = ScriptContext::GetLibrary(this);
    bVar2 = pJVar3 == library;
  }
  else {
    bVar2 = true;
  }
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2b28,
                                "(!VarIs<RecyclableObject>(instance) ? 1 : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library)"
                                ,
                                "!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = JavascriptLibraryBase::GetNull(&library->super_JavascriptLibraryBase);
  return (BOOL)(pRVar5 == (RecyclableObject *)instance);
}

Assistant:

BOOL JavascriptOperators::IsNull(Var instance, JavascriptLibrary* library)
    {
        Assert(!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library );
        return library->GetNull() == instance;
    }